

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::RandomBufferWriteCase::~RandomBufferWriteCase(RandomBufferWriteCase *this)

{
  ~RandomBufferWriteCase(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

~RandomBufferWriteCase (void)
	{
		delete m_verifier;
	}